

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock_conflict *
tb_gen_code_mips(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,uint32_t flags
                ,int cflags)

{
  undefined4 uVar1;
  TCGContext_conflict6 *s;
  CPUArchState_conflict5 *pCVar2;
  TCGContext_conflict6 *pTVar3;
  byte *pbVar4;
  uc_struct_conflict4 *uc;
  uintptr_t uVar5;
  long *plVar6;
  PageDesc *pPVar7;
  tb_page_addr_t tVar8;
  TranslationBlock *pTVar9;
  ulong extraout_RAX;
  TranslationBlock *tb;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  byte *pbVar15;
  tb_page_addr_t *ptVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  ulong uVar18;
  int iVar19;
  byte bVar20;
  tb_page_addr_t phys2;
  bool bVar21;
  bool bVar22;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_90;
  uint local_88;
  undefined4 uStack_84;
  void *local_80;
  uint32_t local_78;
  uint local_74;
  target_ulong_conflict local_70;
  uint32_t local_6c;
  byte *local_68;
  tb_page_addr_t local_60;
  undefined8 local_58;
  CPUArchState_conflict5 *local_50;
  void *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  local_58 = CONCAT44(in_register_00000034,pc);
  s = cpu->uc->tcg_ctx;
  pCVar2 = (CPUArchState_conflict5 *)cpu->env_ptr;
  local_70 = cs_base;
  local_6c = flags;
  local_60 = get_page_addr_code_mips(pCVar2,pc);
  uVar13 = cflags | 0x10000;
  if (local_60 != 0xffffffffffffffff) {
    uVar13 = cflags;
  }
  uVar11 = cpu->cluster_index;
  tb = (TranslationBlock *)(ulong)uVar11;
  uVar17 = cpu->singlestep_enabled;
  ptVar16 = (tb_page_addr_t *)(ulong)uVar17;
  pTVar9 = tcg_tb_alloc_mips((TCGContext_conflict3 *)s);
  if (pTVar9 == (TranslationBlock *)0x0) {
LAB_00741b26:
    tb_gen_code_mips_cold_2();
LAB_00741b30:
    (tb->tc).ptr = local_48;
    s->code_gen_ptr =
         (void *)((long)local_80 + (long)local_48 + ((ulong)ptVar16 & 0xffffffff) + 0xf &
                 0xfffffffffffffff0);
    tb->jmp_list_next[0] = 0;
    tb->jmp_list_next[1] = 0;
    *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
    tb->jmp_dest[0] = 0;
    uVar12 = (ulong)(ushort)tb->page_addr[1];
    if (uVar12 != 0xffff) {
      tb_set_jmp_target_mips(tb,0,uVar12 + *(long *)&tb->cflags);
    }
    pCVar2 = local_50;
    if (*(short *)((long)tb->page_addr + 10) != -1) {
      tb_set_jmp_target_mips
                (tb,1,(ulong)*(ushort *)((long)tb->page_addr + 10) + *(long *)&tb->cflags);
    }
    uVar13 = ((uint)local_58 + (uint)*(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)local_58 & 0xfffff000) != uVar13) {
      phys2 = get_page_addr_code_mips(pCVar2,uVar13);
    }
    tVar8 = local_60;
    uc = (uc_struct_conflict4 *)cpu->uc;
    local_90 = (PageDesc *)0x0;
    pTVar9 = tb;
    if (local_60 == 0xffffffffffffffff) {
      if ((tb->flags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
    }
    else {
      page_lock_pair(uc,(PageDesc **)&local_88,local_60,&local_90,phys2,1);
      plVar6 = (long *)CONCAT44(uStack_84,local_88);
      uVar12 = (ulong)((uint)tVar8 & 0xfffff000);
      tb->page_next[1] = uVar12;
      tb->orig_tb = (TranslationBlock *)*plVar6;
      lVar10 = *plVar6;
      *plVar6 = (long)tb;
      g_free((gpointer)plVar6[1]);
      plVar6[1] = 0;
      *(undefined4 *)(plVar6 + 2) = 0;
      if (lVar10 == 0) {
        tlb_protect_code_mips(uc,uVar12);
      }
      pPVar7 = local_90;
      if (local_90 == (PageDesc *)0x0) {
        tb->page_addr[0] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[0] = phys2;
        tb->page_next[0] = local_90->first_tb;
        uVar5 = local_90->first_tb;
        local_90->first_tb = (ulong)tb | 1;
        g_free(local_90->code_bitmap);
        pPVar7->code_bitmap = (unsigned_long *)0x0;
        pPVar7->code_write_count = 0;
        if (uVar5 == 0) {
          tlb_protect_code_mips(uc,phys2);
        }
      }
      if ((tb->flags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock *)0x0;
        uVar13 = (int)local_60 * -0x7a143589 + 0x24234429;
        uVar11 = uVar13 * 0x2000 | uVar13 >> 0x13;
        uVar13 = (int)(local_60 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar13 = uVar13 * 0x2000 | uVar13 >> 0x13;
        uVar17 = (int)tb->pc * -0x7a143589 + 1;
        uVar17 = uVar17 * 0x2000 | uVar17 >> 0x13;
        uVar13 = (uVar17 * 0x779b1000 | uVar17 * -0x61c8864f >> 0x14) +
                 (int)tb->cs_base * -0x3d4d51c3 +
                 (uVar11 * 0x3c6ef362 | (uint)((int)(uVar11 * -0x61c8864f) < 0)) +
                 (uVar13 * 0x1bbcd880 | uVar13 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
        uVar13 = (tb->flags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar13 * 0x20000 | uVar13 >> 0xf) * 0x27d4eb2f;
        uVar13 = *(int *)&tb->size * -0x3d4d51c3 + (uVar13 * 0x20000 | uVar13 >> 0xf) * 0x27d4eb2f;
        uVar13 = (uVar13 * 0x20000 | uVar13 >> 0xf) * 0x27d4eb2f;
        uVar13 = (uVar13 >> 0xf ^ uVar13) * -0x7a143589;
        uVar13 = (uVar13 >> 0xd ^ uVar13) * -0x3d4d51c3;
        uVar13 = uVar13 >> 0x10 ^ uVar13;
        *(uint *)(tb->jmp_dest + 1) = uVar13;
        qht_insert((uc_struct_conflict5 *)uc,&(uc->tcg_ctx->tb_ctx).htable,tb,uVar13,&local_38);
        if (local_38 != (TranslationBlock *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_84,local_88),(TranslationBlock_conflict *)tb);
          lVar10 = CONCAT44(uStack_84,local_88);
          g_free(*(gpointer *)(lVar10 + 8));
          *(undefined8 *)(lVar10 + 8) = 0;
          *(undefined4 *)(lVar10 + 0x10) = 0;
          pTVar9 = local_38;
          if (local_90 != (PageDesc *)0x0) {
            tb_page_remove(local_90,(TranslationBlock_conflict *)tb);
            pPVar7 = local_90;
            g_free(local_90->code_bitmap);
            pPVar7->code_bitmap = (unsigned_long *)0x0;
            pPVar7->code_write_count = 0;
            pTVar9 = local_38;
          }
        }
      }
    }
    if (pTVar9 == tb) {
      tcg_tb_insert_mips((TCGContext_conflict3 *)s,tb);
      pTVar9 = tb;
    }
    else {
      lVar10 = (long)((uc_struct_conflict4 *)s->gen_insn_data[0x107][2])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_80 - (-lVar10 & lVar10 + 0x97U));
    }
    return (TranslationBlock_conflict *)pTVar9;
  }
  local_78 = uVar11 << 0x18 | uVar13 & 0xffffff;
  uVar13 = uVar13 & 0x7fff;
  uVar11 = 0x200;
  if (uVar13 < 0x200) {
    uVar11 = uVar13;
  }
  if (uVar13 == 0) {
    uVar11 = 0x200;
  }
  uVar13 = 1;
  if (uVar17 == 0) {
    uVar13 = uVar11;
  }
  local_40 = (CPUState *)(pCVar2[-4].tcs[0xd].mmr + 5);
  tb = pTVar9;
  local_50 = pCVar2;
LAB_007418e5:
  local_80 = s->code_gen_ptr;
  *(void **)&tb->cflags = local_80;
  *(int *)&tb->pc = (int)local_58;
  *(target_ulong_conflict *)((long)&tb->pc + 4) = local_70;
  *(uint32_t *)&tb->cs_base = local_6c;
  tb->flags = local_78;
  (tb->tc).size = 0;
  uVar1 = (undefined4)cpu->trace_dstate[0];
  tb->size = (short)uVar1;
  tb->icount = (short)((uint)uVar1 >> 0x10);
  s->tb_cflags = local_78;
  ptVar16 = tb->page_addr + 1;
  do {
    tcg_func_start_mips((TCGContext_conflict3 *)s);
    s->cpu = local_40;
    local_74 = uVar13;
    gen_intermediate_code_mips(cpu,(TranslationBlock_conflict *)tb,uVar13);
    s->cpu = (CPUState *)0x0;
    *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
    s->tb_jmp_reset_offset = (uint16_t *)ptVar16;
    s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar13 = tcg_gen_code_mips((TCGContext_conflict3 *)s,tb);
    if (-1 < (int)uVar13) {
      local_48 = (void *)(ulong)uVar13;
      local_68 = (byte *)((long)local_80 + (long)local_48);
      uVar12 = (ulong)*(ushort *)((long)&tb->cs_base + 6);
      pbVar15 = local_68;
      if (uVar12 == 0) goto LAB_00741af5;
      pTVar3 = cpu->uc->tcg_ctx;
      pbVar4 = (byte *)pTVar3->code_gen_highwater;
      uVar18 = 0;
      goto LAB_00741a00;
    }
    tb_gen_code_mips_cold_1();
    uVar13 = local_88;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_00741b09;
  while (uVar18 = uVar18 + 1, uVar18 != uVar12) {
LAB_00741a00:
    lVar10 = 0;
    do {
      if (uVar18 == 0) {
        iVar19 = 0;
        if (lVar10 == 0) {
          iVar19 = (int)tb->pc;
        }
      }
      else {
        iVar19 = *(int *)((long)(pTVar3->gen_insn_data + -1) + (uVar18 * 6 + lVar10 * 2 + 6) * 2);
      }
      pbVar14 = pbVar15;
      uVar13 = *(int *)((long)pTVar3->gen_insn_data[0] + lVar10 * 4 + uVar18 * 0xc) - iVar19;
      do {
        uVar11 = (int)uVar13 >> 7;
        bVar21 = 0x3f < uVar13;
        bVar22 = (uVar13 & 0x40) == 0;
        pbVar15 = pbVar14 + 1;
        bVar20 = (byte)uVar13 | 0x80;
        if (!bVar21 || !bVar22 && uVar11 == 0xffffffff) {
          bVar20 = (byte)uVar13 & 0x7f;
        }
        *pbVar14 = bVar20;
        pbVar14 = pbVar15;
        uVar13 = uVar11;
      } while (bVar21 && (bVar22 || uVar11 != 0xffffffff));
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (uVar18 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (uint)pTVar3->gen_insn_end_off[uVar18 - 1];
    }
    uVar13 = pTVar3->gen_insn_end_off[uVar18] - uVar13;
    do {
      uVar11 = (int)uVar13 >> 7;
      bVar21 = 0x3f < uVar13;
      bVar22 = (uVar13 & 0x40) == 0;
      pbVar15 = pbVar14 + 1;
      bVar20 = (byte)uVar13 | 0x80;
      if (!bVar21 || !bVar22 && uVar11 == 0xffffffff) {
        bVar20 = (byte)uVar13 & 0x7f;
      }
      *pbVar14 = bVar20;
      pbVar14 = pbVar15;
      uVar13 = uVar11;
    } while (bVar21 && (bVar22 || uVar11 != 0xffffffff));
    if (pbVar4 < pbVar15) {
      ptVar16 = (tb_page_addr_t *)0xffffffff;
      goto LAB_00741b00;
    }
  }
LAB_00741af5:
  ptVar16 = (tb_page_addr_t *)(ulong)(uint)((int)pbVar15 - (int)local_68);
LAB_00741b00:
  if (-1 < (int)ptVar16) goto LAB_00741b30;
LAB_00741b09:
  tb = tcg_tb_alloc_mips((TCGContext_conflict3 *)s);
  uVar13 = local_74;
  if (tb == (TranslationBlock *)0x0) goto LAB_00741b26;
  goto LAB_007418e5;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}